

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_get_direction(command_conflict *cmd,char *arg,int *dir,_Bool allow_5)

{
  _Bool _Var1;
  wchar_t wVar2;
  
  wVar2 = cmd_get_arg_direction(cmd,arg,dir);
  if ((wVar2 != L'\0') || (wVar2 = L'\0', *dir == 5)) {
    _Var1 = get_rep_dir(dir,allow_5);
    if (_Var1) {
      cmd_set_arg_direction(cmd,arg,*dir);
      wVar2 = L'\0';
    }
    else {
      cmd_cancel_repeat();
      wVar2 = L'\xfffffffd';
    }
  }
  return wVar2;
}

Assistant:

int cmd_get_direction(struct command *cmd, const char *arg, int *dir,
					  bool allow_5)
{
	if (cmd_get_arg_direction(cmd, arg, dir) == CMD_OK) {
		/* Validity check */
		if (*dir != DIR_NONE)
			return CMD_OK;
	}

	/* We need to do extra work */
	if (get_rep_dir(dir, allow_5)) {
		cmd_set_arg_direction(cmd, arg, *dir);
		return CMD_OK;
	}

	cmd_cancel_repeat();
	return CMD_ARG_ABORTED;
}